

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.cpp
# Opt level: O0

void __thiscall warrior::addKill(warrior *this,entity *zombieKilled)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  string *local_110;
  allocator local_a6;
  allocator local_a5 [20];
  allocator local_91;
  string *local_90;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined8 local_28;
  int scores [3];
  int size;
  entity *zombieKilled_local;
  warrior *this_local;
  
  unique0x10000266 = zombieKilled;
  iVar1 = entity::getSize(zombieKilled);
  scores[1] = iVar1 + -1;
  local_28 = 0x4b00000032;
  scores[0] = 100;
  addScore(this,scores[(long)(iVar1 + -1) + -2]);
  local_90 = local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Small Zombie",&local_91);
  local_90 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Medium Zombie",local_a5);
  local_90 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Large Zombie",&local_a6);
  std::allocator<char>::~allocator((allocator<char> *)&local_a6);
  std::allocator<char>::~allocator((allocator<char> *)local_a5);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)&this->killList,",");
  }
  std::__cxx11::string::operator+=((string *)&this->killList,local_88 + (long)scores[1] * 0x20);
  poVar3 = std::operator<<((ostream *)&std::cout,local_88 + (long)scores[1] * 0x20);
  std::operator<<(poVar3," Slain!\n");
  local_110 = (string *)&local_28;
  do {
    local_110 = local_110 + -0x20;
    std::__cxx11::string::~string(local_110);
  } while (local_110 != local_88);
  return;
}

Assistant:

void warrior::addKill(entity *zombieKilled) {
    //function to automatically update score and killList from zombie entity
    //also will keep track of katana Leveling
    //note: as of writing, the function will also delete zombie object, may change later

    int size = zombieKilled->getSize() - 1;
    int scores[3] = {50, 75, 100};
    addScore(scores[size]);

    std::string labels[3] = {"Small Zombie", "Medium Zombie", "Large Zombie"};
    if (!killList.empty())
        killList += ",";

    killList += labels[size];

    std::cout << labels[size] << " Slain!\n";
}